

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

int CompareHuffmanTrees(void *ptr1,void *ptr2)

{
  HuffmanTree *t2;
  HuffmanTree *t1;
  void *ptr2_local;
  void *ptr1_local;
  undefined4 local_4;
  
  if (*ptr2 < *ptr1) {
    local_4 = -1;
  }
  else if (*ptr1 < *ptr2) {
    local_4 = 1;
  }
  else {
    local_4 = 1;
    if (*(int *)((long)ptr1 + 4) < *(int *)((long)ptr2 + 4)) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int CompareHuffmanTrees(const void* ptr1, const void* ptr2) {
  const HuffmanTree* const t1 = (const HuffmanTree*)ptr1;
  const HuffmanTree* const t2 = (const HuffmanTree*)ptr2;
  if (t1->total_count > t2->total_count) {
    return -1;
  } else if (t1->total_count < t2->total_count) {
    return 1;
  } else {
    assert(t1->value != t2->value);
    return (t1->value < t2->value) ? -1 : 1;
  }
}